

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

uint32_t __thiscall
spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::get_base_non_block_type_id
          (PhysicalStorageBufferPointerHandler *this,uint32_t type_id)

{
  bool bVar1;
  SPIRType *pSVar2;
  ulong uVar3;
  
  uVar3 = (ulong)type_id;
  pSVar2 = Variant::get<spirv_cross::SPIRType>
                     ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + type_id)
  ;
  if (pSVar2->pointer == true) {
    do {
      type_id = (uint32_t)uVar3;
      if ((pSVar2->storage != StorageClassPhysicalStorageBuffer) ||
         (bVar1 = type_is_bda_block_entry(this,type_id), bVar1)) break;
      type_id = (pSVar2->parent_type).id;
      uVar3 = (ulong)type_id;
      pSVar2 = Variant::get<spirv_cross::SPIRType>
                         ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                          uVar3);
    } while (pSVar2->pointer != false);
  }
  bVar1 = type_is_bda_block_entry(this,type_id);
  if (!bVar1) {
    __assert_fail("type_is_bda_block_entry(type_id)",
                  "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_cross.cpp"
                  ,0x13ea,
                  "uint32_t spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::get_base_non_block_type_id(uint32_t) const"
                 );
  }
  return type_id;
}

Assistant:

uint32_t Compiler::PhysicalStorageBufferPointerHandler::get_base_non_block_type_id(uint32_t type_id) const
{
	auto *type = &compiler.get<SPIRType>(type_id);
	while (type->pointer &&
	       type->storage == StorageClassPhysicalStorageBufferEXT &&
	       !type_is_bda_block_entry(type_id))
	{
		type_id = type->parent_type;
		type = &compiler.get<SPIRType>(type_id);
	}

	assert(type_is_bda_block_entry(type_id));
	return type_id;
}